

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

void scope_destroy(scope sp)

{
  undefined8 *in_RDI;
  set_cb_iterate_args in_stack_00000010;
  set_cb_iterate in_stack_00000018;
  set in_stack_00000020;
  
  if (in_RDI != (undefined8 *)0x0) {
    set_iterate(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    set_destroy((set)sp);
    vector_destroy((vector)0x129cde);
    free((void *)*in_RDI);
    free(in_RDI);
  }
  return;
}

Assistant:

void scope_destroy(scope sp)
{
	if (sp != NULL)
	{
		set_iterate(sp->objects, &scope_destroy_cb_iterate, NULL);

		set_destroy(sp->objects);

		vector_destroy(sp->call_stack);

		free(sp->name);

		free(sp);
	}
}